

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
UA_Client_Subscriptions_addMonitoredItem
          (UA_Client *client,UA_UInt32 subscriptionId,UA_NodeId nodeId,UA_UInt32 attributeID,
          UA_MonitoredItemHandlingFunction hf,void *hfContext,UA_UInt32 *newMonitoredItemId)

{
  UA_UInt32 UVar1;
  UA_Client_MonitoredItem *pUVar2;
  UA_Client_MonitoredItem *__ptr;
  uint uVar3;
  UA_StatusCode UVar4;
  UA_Client_Subscription *pUVar5;
  undefined1 local_218 [24];
  ulong local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  ulong uStack_1c8;
  UA_Double local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  UA_UInt32 local_108;
  undefined4 local_104;
  undefined8 local_100;
  undefined1 *local_f8;
  undefined1 local_f0 [8];
  UA_CreateMonitoredItemsResponse response;
  
  pUVar5 = (UA_Client_Subscription *)&client->subscriptions;
  do {
    pUVar5 = (pUVar5->listEntry).le_next;
    if (pUVar5 == (UA_Client_Subscription *)0x0) {
      return 0x80280000;
    }
  } while (pUVar5->subscriptionID != subscriptionId);
  response.diagnosticInfos = (UA_DiagnosticInfo *)newMonitoredItemId;
  __ptr = (UA_Client_MonitoredItem *)malloc(0x58);
  if (__ptr == (UA_Client_MonitoredItem *)0x0) {
    UVar4 = 0x80030000;
  }
  else {
    local_f8 = local_218;
    local_190 = 0;
    local_1a0 = 0;
    uStack_198 = 0;
    local_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1b8 = 0;
    local_1e0 = 0;
    uStack_1d8 = 0;
    local_1f0 = 0;
    uStack_1e8 = 0;
    uStack_1f8 = 0;
    local_218._0_2_ = nodeId.namespaceIndex;
    local_218._2_2_ = nodeId._2_2_;
    local_218._4_4_ = nodeId.identifierType;
    local_218._8_8_ = nodeId.identifier.string.length;
    local_218._16_8_ = nodeId.identifier.string.data;
    local_200 = (ulong)attributeID;
    local_1d0 = 2;
    uVar3 = client->monitoredItemHandles + 1;
    client->monitoredItemHandles = uVar3;
    uStack_1c8 = (ulong)uVar3;
    local_1c0 = pUVar5->publishingInterval;
    uStack_188 = 0x100000001;
    local_118 = 0;
    uStack_110 = 0;
    local_128 = 0;
    uStack_120 = 0;
    local_138 = 0;
    uStack_130 = 0;
    local_148 = 0;
    uStack_140 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_168 = 0;
    uStack_160 = 0;
    local_178 = 0;
    uStack_170 = 0;
    local_104 = 0;
    local_100 = 1;
    local_108 = subscriptionId;
    __UA_Client_Service(client,&local_178,UA_TYPES + 0x92,local_f0,UA_TYPES + 0x7e);
    UVar4 = response.responseHeader.timestamp._4_4_;
    if ((response.responseHeader.timestamp._4_4_ == 0) &&
       (UVar4 = 0x80010000,
       response.responseHeader.additionalHeader.content.encoded.body.data == (UA_Byte *)0x1)) {
      UVar4 = *(UA_StatusCode *)response.resultsSize;
    }
    if (UVar4 == 0) {
      __ptr->monitoringMode = 2;
      UA_copy(&nodeId,&__ptr->monitoredNodeId,UA_TYPES + 0x10);
      __ptr->attributeID = attributeID;
      __ptr->clientHandle = client->monitoredItemHandles;
      __ptr->samplingInterval = pUVar5->publishingInterval;
      __ptr->queueSize = 1;
      __ptr->discardOldest = true;
      __ptr->handler = hf;
      __ptr->handlerContext = hfContext;
      UVar1 = *(UA_UInt32 *)(response.resultsSize + 4);
      __ptr->monitoredItemId = UVar1;
      pUVar2 = (pUVar5->monitoredItems).lh_first;
      (__ptr->listEntry).le_next = pUVar2;
      if (pUVar2 != (UA_Client_MonitoredItem *)0x0) {
        (pUVar2->listEntry).le_prev = (UA_Client_MonitoredItem **)__ptr;
      }
      (pUVar5->monitoredItems).lh_first = __ptr;
      (__ptr->listEntry).le_prev = &(pUVar5->monitoredItems).lh_first;
      *(UA_UInt32 *)response.diagnosticInfos = UVar1;
      UVar4 = 0;
    }
    else {
      free(__ptr);
    }
    deleteMembers_noInit(local_f0,UA_TYPES + 0x7e);
    memset(local_f0,0,0xa8);
  }
  return UVar4;
}

Assistant:

UA_StatusCode
UA_Client_Subscriptions_addMonitoredItem(UA_Client *client, UA_UInt32 subscriptionId,
                                         UA_NodeId nodeId, UA_UInt32 attributeID,
                                         UA_MonitoredItemHandlingFunction hf,
                                         void *hfContext, UA_UInt32 *newMonitoredItemId) {
    UA_Client_Subscription *sub;
    LIST_FOREACH(sub, &client->subscriptions, listEntry) {
        if(sub->subscriptionID == subscriptionId)
            break;
    }
    if(!sub)
        return UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;

    /* Create the handler */
    UA_Client_MonitoredItem *newMon = UA_malloc(sizeof(UA_Client_MonitoredItem));
    if(!newMon)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    /* Send the request */
    UA_CreateMonitoredItemsRequest request;
    UA_CreateMonitoredItemsRequest_init(&request);
    request.subscriptionId = subscriptionId;
    UA_MonitoredItemCreateRequest item;
    UA_MonitoredItemCreateRequest_init(&item);
    item.itemToMonitor.nodeId = nodeId;
    item.itemToMonitor.attributeId = attributeID;
    item.monitoringMode = UA_MONITORINGMODE_REPORTING;
    item.requestedParameters.clientHandle = ++(client->monitoredItemHandles);
    item.requestedParameters.samplingInterval = sub->publishingInterval;
    item.requestedParameters.discardOldest = true;
    item.requestedParameters.queueSize = 1;
    request.itemsToCreate = &item;
    request.itemsToCreateSize = 1;
    UA_CreateMonitoredItemsResponse response = UA_Client_Service_createMonitoredItems(client, request);

    // slight misuse of retval here to check if the addition was successfull.
    UA_StatusCode retval = response.responseHeader.serviceResult;
    if(retval == UA_STATUSCODE_GOOD) {
        if(response.resultsSize == 1)
            retval = response.results[0].statusCode;
        else
            retval = UA_STATUSCODE_BADUNEXPECTEDERROR;
    }
    if(retval != UA_STATUSCODE_GOOD) {
        UA_free(newMon);
        UA_CreateMonitoredItemsResponse_deleteMembers(&response);
        return retval;
    }

    /* Set the handler */
    newMon->monitoringMode = UA_MONITORINGMODE_REPORTING;
    UA_NodeId_copy(&nodeId, &newMon->monitoredNodeId);
    newMon->attributeID = attributeID;
    newMon->clientHandle = client->monitoredItemHandles;
    newMon->samplingInterval = sub->publishingInterval;
    newMon->queueSize = 1;
    newMon->discardOldest = true;
    newMon->handler = hf;
    newMon->handlerContext = hfContext;
    newMon->monitoredItemId = response.results[0].monitoredItemId;
    LIST_INSERT_HEAD(&sub->monitoredItems, newMon, listEntry);
    *newMonitoredItemId = newMon->monitoredItemId;

    UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_CLIENT,
                 "Created a monitored item with client handle %u",
                 client->monitoredItemHandles);

    UA_CreateMonitoredItemsResponse_deleteMembers(&response);
    return UA_STATUSCODE_GOOD;
}